

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reactor_impl.h
# Opt level: O2

void __thiscall
iqnet::Reactor<boost::mutex>::unregister_handler
          (Reactor<boost::mutex> *this,Event_handler *eh,Event_mask mask)

{
  ushort uVar1;
  int iVar2;
  hs_iterator __position;
  scoped_lock lk;
  int local_3c;
  unique_lock<boost::mutex> local_38;
  
  boost::unique_lock<boost::mutex>::unique_lock(&local_38,&this->lock);
  __position = find_handler_state(this,eh);
  if ((__position._M_node != (_List_node_base *)&this->handlers_states) &&
     (uVar1 = (ushort)(mask == 0) & *(ushort *)((long)&__position._M_node[1]._M_next + 4),
     *(ushort *)((long)&__position._M_node[1]._M_next + 4) = uVar1, uVar1 == 0)) {
    local_3c = (*eh->_vptr_Event_handler[9])(eh);
    std::
    _Rb_tree<int,_std::pair<const_int,_iqnet::Event_handler_*>,_std::_Select1st<std::pair<const_int,_iqnet::Event_handler_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_iqnet::Event_handler_*>_>_>
    ::erase(&(this->handlers)._M_t,&local_3c);
    std::__cxx11::
    list<iqnet::Reactor_base::HandlerState,_std::allocator<iqnet::Reactor_base::HandlerState>_>::
    erase(&this->handlers_states,(const_iterator)__position._M_node);
    iVar2 = (*eh->_vptr_Event_handler[2])(eh);
    if ((char)iVar2 != '\0') {
      this->num_stoppers = this->num_stoppers - 1;
    }
  }
  boost::unique_lock<boost::mutex>::~unique_lock(&local_38);
  return;
}

Assistant:

void Reactor<Lock>::unregister_handler( Event_handler* eh, Event_mask mask )
{
  scoped_lock lk(lock);
  hs_iterator i = find_handler_state( eh );

  if( i != end() )
  {
    int newmask = (i->mask &= !mask);

    if( !newmask )
    {
      handlers.erase(eh->get_handler());
      handlers_states.erase(i);

      if (eh->is_stopper())
        num_stoppers--;
    }
  }
}